

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_createcosmetic(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  char *pcVar7;
  double dVar8;
  char wlname [4608];
  char arg2 [4608];
  char arg1 [4608];
  
  if (*argument == '\0') {
    send_to_char("createcosmetic \'wear location\' <name>\n\r",ch);
    send_to_char("createcosmetic under <eq location> \'wear location\' <name>\n\r",ch);
    send_to_char("createcosmetic eqlocations\n\r",ch);
    send_to_char("createcosmetic wear <eq location> <name>\n\r\n\r",ch);
    send_to_char("Example 1: createcosmetic \'on earlobe\' a jewel-encrusted earring\n\rwould produce \'a jewel-encrusted earring\' that\'s <worn on earlobe>\n\r"
                 ,ch);
    send_to_char("Example 2: createcosmetic under arms \'as undershirt\' a plain white t-shirt\n\rwould produce \'a plain white t-shirt\' that\'s <worn as undershirt> and visible only when arms are not covered.\n\r"
                 ,ch);
    send_to_char("Example 3: createcosmetic eqlocations will show all valid values for <eq location>\n\r"
                 ,ch);
    return;
  }
  pcVar6 = one_argument(argument,arg1);
  bVar2 = str_cmp(arg1,"eqlocations");
  if (!bVar2) {
    show_flag_cmds(ch,wear_flags);
    return;
  }
  bVar2 = str_cmp(arg1,"under");
  if (bVar2) {
    bVar3 = str_cmp(arg1,"wear");
    if (bVar3) {
      strcpy(wlname,arg1);
      bVar4 = str_cmp(pcVar6,"");
      iVar5 = 0;
      bVar3 = false;
      if (!bVar4) {
        return;
      }
    }
    else {
      pcVar6 = one_argument(pcVar6,arg2);
      bVar3 = str_cmp(arg2,"");
      if (((!bVar3) || (bVar3 = str_cmp(pcVar6,""), !bVar3)) ||
         (iVar5 = flag_value(wear_flags,arg2), iVar5 == -99)) goto LAB_0032bf30;
      bVar3 = true;
    }
  }
  else {
    pcVar6 = one_argument(pcVar6,arg2);
    pcVar6 = one_argument(pcVar6,wlname);
    bVar3 = str_cmp(arg2,"");
    if ((((!bVar3) || (bVar3 = str_cmp(wlname,""), !bVar3)) || (bVar3 = str_cmp(pcVar6,""), !bVar3))
       || (iVar5 = flag_value(wear_flags,arg2), iVar5 == -99)) {
LAB_0032bf30:
      send_to_char("Invalid arguments.\n\r",ch);
      return;
    }
    bVar3 = false;
  }
  pObjIndex = get_obj_index(0x28);
  obj = create_object(pObjIndex,0);
  if (bVar2) {
    if (!bVar3) goto LAB_0032bf8a;
    dVar8 = ldexp(1.0,iVar5 % 0x20);
    obj->wear_flags[iVar5 / 0x20] = obj->wear_flags[iVar5 / 0x20] | (long)dVar8;
  }
  else {
    pbVar1 = (byte *)((long)obj->extra_flags + 2);
    *pbVar1 = *pbVar1 | 0x20;
    dVar8 = ldexp(1.0,iVar5 % 0x20);
    obj->wear_flags[iVar5 / 0x20] = obj->wear_flags[iVar5 / 0x20] | (long)dVar8;
    if (!bVar3) goto LAB_0032bf8a;
  }
  pbVar1 = (byte *)((long)obj->wear_flags + 2);
  *pbVar1 = *pbVar1 & 0xfb;
LAB_0032bf8a:
  free_pstring(obj->name);
  pcVar7 = palloc_string(pcVar6);
  obj->name = pcVar7;
  free_pstring(obj->short_descr);
  pcVar6 = palloc_string(pcVar6);
  obj->short_descr = pcVar6;
  obj_to_char(obj,ch);
  if (!bVar3) {
    if (obj->wear_loc_name != (char *)0x0) {
      free_pstring(obj->wear_loc_name);
    }
    pcVar6 = palloc_string(wlname);
    obj->wear_loc_name = pcVar6;
  }
  act("You create $p.",ch,obj,(void *)0x0,3);
  return;
}

Assistant:

void do_createcosmetic(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], wlname[MSL], *wearname;
	OBJ_DATA *obj;
	int value = 0;
	bool under= false, wear= false;

	if (!strcmp(argument, ""))
	{
		send_to_char("createcosmetic 'wear location' <name>\n\r", ch);
		send_to_char("createcosmetic under <eq location> 'wear location' <name>\n\r", ch);
		send_to_char("createcosmetic eqlocations\n\r", ch);
		send_to_char("createcosmetic wear <eq location> <name>\n\r\n\r", ch);
		send_to_char("Example 1: createcosmetic 'on earlobe' a jewel-encrusted earring\n\rwould produce 'a "\
					 "jewel-encrusted earring' that's <worn on earlobe>\n\r", ch);
		send_to_char("Example 2: createcosmetic under arms 'as undershirt' a plain white t-shirt\n\rwould produce 'a "\
					 "plain white t-shirt' that's <worn as undershirt> and visible only when arms are not covered.\n\r", ch);
		send_to_char("Example 3: createcosmetic eqlocations will show all valid values for <eq location>\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	if (!str_cmp(arg1, "eqlocations"))
	{
		show_flag_cmds(ch, wear_flags);
		return;
	}
	else if (!str_cmp(arg1, "under"))
	{
		argument = one_argument(argument, arg2);
		argument = one_argument(argument, wlname);
		if (!str_cmp(arg2, "")
			|| !str_cmp(wlname, "")
			|| !str_cmp(argument, "")
			||  (value = flag_value(wear_flags, arg2)) == NO_FLAG)
		{
			send_to_char("Invalid arguments.\n\r", ch);
			return;
		}

		under = true;
	}
	else if (!str_cmp(arg1, "wear"))
	{
		argument = one_argument(argument, arg2);
		if (!str_cmp(arg2, "")
			|| !str_cmp(argument, "")
			|| (value = flag_value(wear_flags, arg2)) == NO_FLAG)
		{
			send_to_char("Invalid arguments.\n\r", ch);
			return;
		}

		wear = true;
	}
	else if (!wear && !under)
	{
		strcpy(&wlname[0], &arg1[0]);

		if (!str_cmp(argument, ""))
			return;
	}
	else
	{
		return;
	}

	obj = create_object(get_obj_index(40), 0);

	if (under)
		SET_BIT(obj->extra_flags, ITEM_UNDER_CLOTHES);

	if (under || wear)
		SET_BIT(obj->wear_flags, value);

	if (wear)
		REMOVE_BIT(obj->wear_flags, ITEM_WEAR_COSMETIC);

	free_pstring(obj->name);
	obj->name = palloc_string(argument);

	free_pstring(obj->short_descr);
	obj->short_descr = palloc_string(argument);

	obj_to_char(obj, ch);

	if (!wear)
	{
		if (obj->wear_loc_name)
			free_pstring(obj->wear_loc_name);

		obj->wear_loc_name = palloc_string(wlname);
	}

	act("You create $p.", ch, obj, 0, TO_CHAR);
}